

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_32sto12u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  OPJ_INT32 OVar2;
  ulong uVar3;
  
  uVar3 = 0;
  if ((length & 0xfffffffffffffffe) != 0) {
    do {
      uVar1 = pSrc[uVar3];
      OVar2 = pSrc[uVar3 + 1];
      *pDst = (OPJ_BYTE)(uVar1 >> 4);
      pDst[1] = (byte)((uint)OVar2 >> 8) | (byte)(uVar1 << 4);
      pDst[2] = (OPJ_BYTE)OVar2;
      pDst = pDst + 3;
      uVar3 = uVar3 + 2;
    } while (uVar3 < (length & 0xfffffffffffffffe));
  }
  if ((length & 1) != 0) {
    uVar1 = pSrc[uVar3];
    *pDst = (OPJ_BYTE)(uVar1 >> 4);
    pDst[1] = (char)uVar1 << 4;
  }
  return;
}

Assistant:

static void tif_32sto12u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i+=2U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		
		*pDst++ = (OPJ_BYTE)(src0 >> 4);
		*pDst++ = (OPJ_BYTE)(((src0 & 0xFU) << 4) | (src1 >> 8));
		*pDst++ = (OPJ_BYTE)(src1);
	}
	
	if (length & 1U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		*pDst++ = (OPJ_BYTE)(src0 >> 4);
		*pDst++ = (OPJ_BYTE)(((src0 & 0xFU) << 4));
	}
}